

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
mprpc::MpRpcClient::asnyc_call_abi_cxx11_
          (MpRpcClient *this,char *method,char *params,size_t params_size,int timeout_ms)

{
  int *piVar1;
  int iVar2;
  undefined5 uVar3;
  undefined3 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  MpRpcClient *this_00;
  uint16_t val;
  ushort uVar8;
  char *pcVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint uVar10;
  msgpack_sbuffer *sbuf;
  undefined4 in_register_00000084;
  undefined4 in_R9D;
  MsgPackPacker pk;
  uchar d;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> msg;
  MsgPackPacker local_c8;
  undefined4 local_9c;
  undefined1 local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  uint local_80;
  undefined4 uStack_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  MpRpcClient *local_38;
  
  local_c8.pk.data = &local_c8;
  LOCK();
  piVar1 = (int *)(method + 0x548);
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  local_c8.sb.size = 0;
  local_c8.sb.data = (char *)0x0;
  local_c8.sb.alloc = 0;
  local_c8.pk.callback = msgpack_sbuffer_write;
  local_9c = in_R9D;
  local_38 = this;
  pcVar9 = (char *)realloc((void *)0x0,0x2000);
  if (pcVar9 != (char *)0x0) {
    pcVar9[local_c8.sb.size] = -0x7d;
    local_c8.sb.size = local_c8.sb.size + 1;
    local_c8.sb.data = pcVar9;
    local_c8.sb.alloc = 0x2000;
  }
  local_98[0] = 0xa2;
  (*local_c8.pk.callback)(local_c8.pk.data,local_98,1);
  (*local_c8.pk.callback)(local_c8.pk.data,"id",2);
  uVar10 = iVar2 + 1;
  local_58._0_4_ = uVar10;
  uVar7 = local_58._M_unused._0_8_;
  uVar8 = (ushort)uVar10;
  local_58._M_pod_data[0] = (char)uVar10;
  uVar4 = local_98._5_3_;
  uVar3 = local_98._3_5_;
  local_58._M_unused._M_member_pointer = uVar7;
  if ((int)uVar10 < -0x20) {
    if ((int)uVar10 < -0x8000) {
      local_98._1_4_ =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 * 0x1000000;
      local_98[0] = 0xd2;
      local_98 = (undefined1  [8])CONCAT35(uVar4,local_98._0_5_);
      (*local_c8.pk.callback)(local_c8.pk.data,local_98,5);
    }
    else if ((int)uVar10 < -0x80) {
      local_98._1_2_ = uVar8 << 8 | uVar8 >> 8;
      local_98[0] = 0xd1;
      local_98 = (undefined1  [8])CONCAT53(uVar3,local_98._0_3_);
      (*local_c8.pk.callback)(local_c8.pk.data,local_98,3);
    }
    else {
      local_98[1] = local_58._M_pod_data[0];
      local_98[0] = 0xd0;
      (*local_c8.pk.callback)(local_c8.pk.data,local_98,2);
    }
  }
  else if ((int)uVar10 < 0x80) {
    (*local_c8.pk.callback)(local_c8.pk.data,local_58._M_pod_data,1);
  }
  else if ((int)uVar10 < 0x100) {
    local_98[1] = local_58._M_pod_data[0];
    local_98[0] = 0xcc;
    (*local_c8.pk.callback)(local_c8.pk.data,local_98,2);
  }
  else if ((int)uVar10 < 0x10000) {
    local_98._1_2_ = uVar8 << 8 | uVar8 >> 8;
    local_98[0] = 0xcd;
    local_98 = (undefined1  [8])CONCAT53(uVar3,local_98._0_3_);
    (*local_c8.pk.callback)(local_c8.pk.data,local_98,3);
  }
  else {
    local_98._1_4_ =
         uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 * 0x1000000;
    local_98[0] = 0xce;
    local_98 = (undefined1  [8])CONCAT35(uVar4,local_98._0_5_);
    (*local_c8.pk.callback)(local_c8.pk.data,local_98,5);
  }
  MsgPackPacker::pack_map_item(&local_c8,"method",params);
  local_98[0] = 0xa6;
  (*local_c8.pk.callback)(local_c8.pk.data,local_98,1);
  (*local_c8.pk.callback)(local_c8.pk.data,"params",6);
  (*local_c8.pk.callback)
            (local_c8.pk.data,(char *)params_size,CONCAT44(in_register_00000084,timeout_ms));
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,char*&,unsigned_long&>
            (&local_60,&local_68,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_98,&local_c8.sb.data,(unsigned_long *)&local_c8);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015e760;
  local_90 = this_01 + 1;
  *(undefined4 *)&this_01[1]._vptr__Sp_counted_base = 1;
  *(MessageLoop **)&this_01[1]._M_use_count = (MessageLoop *)(method + 0x10);
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[3]._M_use_count = 0;
  this_01[3]._M_weak_count = 0;
  this_01[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[4]._M_use_count = 0;
  this_01[4]._M_weak_count = 0;
  this_01[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[5]._M_use_count = 0;
  this_01[5]._M_weak_count = 0;
  this_01[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[6]._M_use_count = 0;
  this_01[6]._M_weak_count = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = 2;
  }
  uStack_7c = local_9c;
  local_78 = local_68;
  local_70 = local_60._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_98 = (undefined1  [8])method;
  local_88 = this_01;
  local_80 = uVar10;
  local_58._M_unused._M_object = operator_new(0x30);
  p_Var6 = local_70;
  p_Var5 = local_88;
  *(undefined1 (*) [8])local_58._M_unused._0_8_ = local_98;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 8) = local_90;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x10) = p_Var5
  ;
  local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(ulong *)((long)local_58._M_unused._0_8_ + 0x18) = CONCAT44(uStack_7c,local_80);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
   ((long)local_58._M_unused._0_8_ + 0x20) = local_78;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x28) = 0;
  local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x28) = p_Var6
  ;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:232:36)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:232:36)>
             ::_M_manager;
  loop::MessageLoop::post_task((MessageLoop *)(method + 0x10),(Closure *)&local_58);
  this_00 = local_38;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  loop::
  Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_future((Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  free(local_c8.sb.data);
  return (Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00;
}

Assistant:

Future<MpRpcMessage, pair<int, string>> MpRpcClient::asnyc_call(const char* method, const char* params, size_t params_size, int timeout_ms)
    {
        int callid = ++m_cur_callid;
        MsgPackPacker pk;
        pk.pack_map(3);
        pk.pack_map_item("id", callid);
        pk.pack_map_item("method", method);
        pk.pack_map_item_obj("params", params, params_size);

        auto msg = make_shared<string>(pk.sb.data, pk.sb.size);
        auto prom = make_shared<AsyncCallPromise>(&this->m_msg_loop);

        this->msg_loop().post_task([this, prom, callid, timeout_ms, msg]() {
            m_conn->send(msg->data(), msg->size());
            m_on_rsp_map[callid] = OnRspHandler(prom, system_clock::now() + milliseconds(timeout_ms));
        });
        return prom->get_future();
    }